

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

result_type * __thiscall
pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
          (result_type *__return_storage_ptr__,parser<json_out_callbacks> *this)

{
  matcher<json_out_callbacks> *pmVar1;
  pointer pcVar2;
  int line;
  _Elt_pointer puVar3;
  pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
  res;
  ushort local_52;
  char *local_50;
  byte local_48 [8];
  long *local_40;
  char local_38;
  
  puVar3 = (this->stack_).c.
           super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if ((puVar3 != (this->stack_).c.
                 super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur) && ((this->error_)._M_value == 0))
  {
    local_50 = "handler->is_done ()";
    do {
      if (puVar3 == (this->stack_).c.
                    super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        puVar3 = (this->stack_).c.
                 super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      pmVar1 = puVar3[-1]._M_t.
               super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
               .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
               _M_head_impl;
      local_52 = 0;
      (*pmVar1->_vptr_matcher[2])(local_48,pmVar1,this,&local_52);
      if ((char)local_52 == '\x01') {
        local_52 = local_52 & 0xff00;
      }
      if ((puVar3[-1]._M_t.
           super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
           .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
          _M_head_impl)->state_ != 1) {
        line = 0x73f;
LAB_00127721:
        assert_failed(local_50,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,line);
      }
      if (local_38 == '\0') {
        line = 0x740;
        local_50 = "res.second";
        goto LAB_00127721;
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
      ::pop_back(&(this->stack_).c);
      if (local_40 != (long *)0x0) {
        (**(code **)(*local_40 + (ulong)local_48[0] * 8))();
      }
      puVar3 = (this->stack_).c.
               super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    } while ((puVar3 != (this->stack_).c.
                        super__Deque_base<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) &&
            ((this->error_)._M_value == 0));
  }
  if ((this->error_)._M_value == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->callbacks_).out_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (this->callbacks_).out_._M_string_length);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

auto parser<Callbacks>::eof () -> result_type {
            while (!stack_.empty () && !has_error ()) {
                auto & handler = stack_.top ();
                auto res = handler->consume (*this, nothing<char> ());
                PSTORE_ASSERT (handler->is_done ());
                PSTORE_ASSERT (res.second);
                stack_.pop (); // release the topmost matcher object.
            }
            return has_error () ? details::default_return<result_type>::get ()
                                : this->callbacks ().result ();
        }